

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>::
operator()(QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_>
           *this,idx_t *input)

{
  DataChunk *result;
  MadAccessor<long,_long,_long> *pMVar1;
  CURSOR *pCVar2;
  ulong seek_idx;
  reference pvVar3;
  ulong uVar4;
  long lVar5;
  
  pMVar1 = this->outer;
  pCVar2 = this->inner->data;
  seek_idx = *input;
  uVar4 = (pCVar2->scan).current_row_index;
  if ((pCVar2->scan).next_row_index <= seek_idx || seek_idx < uVar4) {
    result = &pCVar2->page;
    ColumnDataCollection::Seek(pCVar2->inputs,seek_idx,&pCVar2->scan,result);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    pCVar2->data = (long *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    pCVar2->validity = &pvVar3->validity;
    uVar4 = (pCVar2->scan).current_row_index;
  }
  lVar5 = pCVar2->data[(uint)((int)seek_idx - (int)uVar4)] - *pMVar1->median;
  if (lVar5 < 1) {
    lVar5 = -lVar5;
  }
  return lVar5;
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}